

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::bindFramebuffer(ReferenceContext *this,deUint32 target,deUint32 name)

{
  int *piVar1;
  Framebuffer *object;
  Framebuffer *this_00;
  ulong uVar2;
  int ndx;
  int iVar3;
  long lVar4;
  
  if ((target - 0x8ca8 < 2) || (target == 0x8d40)) {
    iVar3 = 0;
    if (name == 0) {
      this_00 = (Framebuffer *)0x0;
    }
    else {
      this_00 = rc::ObjectManager<sglr::rc::Framebuffer>::find(&this->m_framebuffers,name);
      if (this_00 == (Framebuffer *)0x0) {
        this_00 = (Framebuffer *)operator_new(0x50);
        rc::Framebuffer::Framebuffer(this_00,name);
        rc::ObjectManager<sglr::rc::Framebuffer>::insert(&this->m_framebuffers,this_00);
      }
    }
    for (; iVar3 != 2; iVar3 = iVar3 + 1) {
      if (target == 0x8d40 || (iVar3 == 0 ^ 0x8ca9) == target) {
        uVar2 = (ulong)(iVar3 != 0);
        if (*(long *)((this->m_clearColor).m_data + uVar2 * 2 + -0x1a) != 0) {
          for (lVar4 = 0x10;
              object = *(Framebuffer **)((this->m_clearColor).m_data + uVar2 * 2 + -0x1a),
              lVar4 != 0x4c; lVar4 = lVar4 + 0x14) {
            releaseFboAttachmentReference
                      (this,(Attachment *)((long)object->m_attachments + lVar4 + -0x10));
          }
          rc::ObjectManager<sglr::rc::Framebuffer>::releaseReference(&this->m_framebuffers,object);
        }
        if (this_00 != (Framebuffer *)0x0) {
          piVar1 = &(this_00->super_NamedObject).m_refCount;
          *piVar1 = *piVar1 + 1;
          for (lVar4 = 0; lVar4 != 0x3c; lVar4 = lVar4 + 0x14) {
            acquireFboAttachmentReference
                      (this,(Attachment *)((long)&this_00->m_attachments[0].type + lVar4));
          }
        }
        *(Framebuffer **)((this->m_clearColor).m_data + uVar2 * 2 + -0x1a) = this_00;
      }
    }
  }
  else if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::bindFramebuffer (deUint32 target, deUint32 name)
{
	Framebuffer* fbo = DE_NULL;

	RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
				target != GL_DRAW_FRAMEBUFFER	&&
				target != GL_READ_FRAMEBUFFER, GL_INVALID_ENUM, RC_RET_VOID);

	if (name != 0)
	{
		// Find or create framebuffer object.
		fbo = m_framebuffers.find(name);
		if (!fbo)
		{
			fbo = new Framebuffer(name);
			m_framebuffers.insert(fbo);
		}
	}

	for (int ndx = 0; ndx < 2; ndx++)
	{
		deUint32			bindingTarget	= ndx ? GL_DRAW_FRAMEBUFFER			: GL_READ_FRAMEBUFFER;
		rc::Framebuffer*&	binding			= ndx ? m_drawFramebufferBinding	: m_readFramebufferBinding;

		if (target != GL_FRAMEBUFFER && target != bindingTarget)
			continue; // Doesn't match this target.

		// Remove old references
		if (binding)
		{
			// Clear all attachment point references
			for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
				releaseFboAttachmentReference(binding->getAttachment((Framebuffer::AttachmentPoint)point));

			m_framebuffers.releaseReference(binding);
		}

		// Create new references
		if (fbo)
		{
			m_framebuffers.acquireReference(fbo);

			for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
				acquireFboAttachmentReference(fbo->getAttachment((Framebuffer::AttachmentPoint)point));
		}

		binding = fbo;
	}
}